

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int32 ngram_model_add_class
                (ngram_model_t *model,char *classname,float32 classweight,char **words,
                float32 *weights,int32 n_words)

{
  int32 iVar1;
  uint uVar2;
  glist_t classwords_00;
  ngram_class_t *pnVar3;
  ngram_class_s **ppnVar4;
  int32 local_60;
  int32 wid;
  int32 tag_wid;
  int32 classid;
  int32 start_wid;
  int32 i;
  glist_t classwords;
  ngram_class_t *lmclass;
  int32 n_words_local;
  float32 *weights_local;
  char **words_local;
  float32 classweight_local;
  char *classname_local;
  ngram_model_t *model_local;
  
  _start_wid = (glist_t)0x0;
  tag_wid = -1;
  local_60 = ngram_wid(model,classname);
  iVar1 = ngram_unknown_wid(model);
  if ((local_60 == iVar1) &&
     (local_60 = ngram_model_add_word(model,classname,classweight), local_60 == -1)) {
    model_local._4_4_ = 0xffffffff;
  }
  else if (model->n_classes == 0x80) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
            ,0x352,"Number of classes cannot exceed 128 (sorry)\n");
    model_local._4_4_ = 0xffffffff;
  }
  else {
    model_local._4_4_ = (uint)model->n_classes;
    for (classid = 0; classid < n_words; classid = classid + 1) {
      uVar2 = ngram_add_word_internal(model,words[classid],model_local._4_4_);
      if (uVar2 == 0xffffffff) {
        return -1;
      }
      if (tag_wid == -1) {
        tag_wid = uVar2 & 0xffffff;
      }
      _start_wid = glist_add_float32(_start_wid,weights[classid]);
    }
    classwords_00 = glist_reverse(_start_wid);
    pnVar3 = ngram_class_new(model,local_60,tag_wid,classwords_00);
    glist_free(classwords_00);
    if (pnVar3 == (ngram_class_t *)0x0) {
      model_local._4_4_ = 0xffffffff;
    }
    else {
      model->n_classes = model->n_classes + '\x01';
      if (model->classes == (ngram_class_s **)0x0) {
        ppnVar4 = (ngram_class_s **)
                  __ckd_calloc__(1,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                 ,0x368);
        model->classes = ppnVar4;
      }
      else {
        ppnVar4 = (ngram_class_s **)
                  __ckd_realloc__(model->classes,(ulong)model->n_classes << 3,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                  ,0x36c);
        model->classes = ppnVar4;
      }
      model->classes[(int)model_local._4_4_] = pnVar3;
    }
  }
  return model_local._4_4_;
}

Assistant:

int32
ngram_model_add_class(ngram_model_t * model,
                      const char *classname,
                      float32 classweight,
                      char **words, const float32 * weights, int32 n_words)
{
    ngram_class_t *lmclass;
    glist_t classwords = NULL;
    int32 i, start_wid = -1;
    int32 classid, tag_wid;

    /* Check if classname already exists in model.  If not, add it. */
    if ((tag_wid =
         ngram_wid(model, classname)) == ngram_unknown_wid(model)) {
        tag_wid = ngram_model_add_word(model, classname, classweight);
        if (tag_wid == NGRAM_INVALID_WID)
            return -1;
    }

    if (model->n_classes == 128) {
        E_ERROR("Number of classes cannot exceed 128 (sorry)\n");
        return -1;
    }
    classid = model->n_classes;
    for (i = 0; i < n_words; ++i) {
        int32 wid;

        wid = ngram_add_word_internal(model, words[i], classid);
        if (wid == NGRAM_INVALID_WID)
            return -1;
        if (start_wid == -1)
            start_wid = NGRAM_BASEWID(wid);
        classwords = glist_add_float32(classwords, weights[i]);
    }
    classwords = glist_reverse(classwords);
    lmclass = ngram_class_new(model, tag_wid, start_wid, classwords);
    glist_free(classwords);
    if (lmclass == NULL)
        return -1;

    ++model->n_classes;
    if (model->classes == NULL)
        model->classes = ckd_calloc(1, sizeof(*model->classes));
    else
        model->classes = ckd_realloc(model->classes,
                                     model->n_classes *
                                     sizeof(*model->classes));
    model->classes[classid] = lmclass;
    return classid;
}